

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_inspect(uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uchar uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  if (in == (uchar *)0x0 || insize == 0) {
    state->error = 0x30;
    uVar8 = 0x30;
  }
  else if (insize < 0x21) {
    state->error = 0x1b;
    uVar8 = 0x1b;
  }
  else {
    lodepng_info_cleanup(&state->info_png);
    (state->info_png).color.key_defined = 0;
    (state->info_png).color.key_r = 0;
    (state->info_png).color.key_g = 0;
    (state->info_png).color.key_b = 0;
    (state->info_png).color.colortype = LCT_RGBA;
    (state->info_png).color.bitdepth = 8;
    (state->info_png).color.palette = (uchar *)0x0;
    (state->info_png).color.palettesize = 0;
    (state->info_png).interlace_method = 0;
    (state->info_png).compression_method = 0;
    (state->info_png).filter_method = 0;
    (state->info_png).phys_defined = 0;
    (state->info_png).gama_defined = 0;
    (state->info_png).chrm_defined = 0;
    (state->info_png).srgb_defined = 0;
    (state->info_png).iccp_defined = 0;
    (state->info_png).background_defined = 0;
    (state->info_png).background_r = 0;
    (state->info_png).background_g = 0;
    (state->info_png).background_b = 0;
    (state->info_png).text_num = 0;
    (state->info_png).text_keys = (char **)0x0;
    (state->info_png).text_strings = (char **)0x0;
    (state->info_png).itext_num = 0;
    (state->info_png).itext_keys = (char **)0x0;
    (state->info_png).itext_langtags = (char **)0x0;
    (state->info_png).itext_transkeys = (char **)0x0;
    (state->info_png).itext_strings = (char **)0x0;
    (state->info_png).time_defined = 0;
    (state->info_png).iccp_name = (char *)0x0;
    (state->info_png).iccp_profile = (uchar *)0x0;
    (state->info_png).unknown_chunks_data[0] = (uchar *)0x0;
    (state->info_png).unknown_chunks_data[1] = (uchar *)0x0;
    (state->info_png).unknown_chunks_data[2] = (uchar *)0x0;
    (state->info_png).unknown_chunks_size[0] = 0;
    (state->info_png).unknown_chunks_size[1] = 0;
    (state->info_png).unknown_chunks_size[2] = 0;
    if (((((*in == 0x89) && (in[1] == 'P')) && (in[2] == 'N')) &&
        ((in[3] == 'G' && (in[4] == '\r')))) &&
       ((in[5] == '\n' && ((in[6] == '\x1a' && (in[7] == '\n')))))) {
      uVar8 = *(uint *)(in + 8);
      if ((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18) == 0xd)
      {
        uVar6 = lodepng_chunk_type_equals(in + 8,"IHDR");
        if (uVar6 == '\0') {
          state->error = 0x1d;
          uVar8 = 0x1d;
        }
        else {
          uVar8 = *(uint *)(in + 0x10);
          uVar7 = *(uint *)(in + 0x14);
          uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
          if (w != (uint *)0x0) {
            *w = uVar8;
          }
          uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          if (h != (uint *)0x0) {
            *h = uVar7;
          }
          bVar1 = in[0x18];
          (state->info_png).color.bitdepth = (uint)bVar1;
          bVar2 = in[0x19];
          (state->info_png).color.colortype = (uint)bVar2;
          bVar3 = in[0x1a];
          (state->info_png).compression_method = (uint)bVar3;
          bVar4 = in[0x1b];
          (state->info_png).filter_method = (uint)bVar4;
          bVar5 = in[0x1c];
          (state->info_png).interlace_method = (uint)bVar5;
          if ((uVar8 == 0) || (uVar7 == 0)) {
            state->error = 0x5d;
            uVar8 = 0x5d;
          }
          else {
            uVar8 = checkColorValidity((uint)bVar2,(uint)bVar1);
            state->error = uVar8;
            if (uVar8 == 0) {
              if (bVar3 == 0) {
                if (bVar4 == 0) {
                  if (bVar5 < 2) {
                    if ((state->decoder).ignore_crc == 0) {
                      uVar7 = 0xffffffff;
                      lVar9 = 0xc;
                      do {
                        uVar7 = uVar7 >> 8 ^ lodepng_crc32_table[(byte)(in[lVar9] ^ (byte)uVar7)];
                        lVar9 = lVar9 + 1;
                      } while (lVar9 != 0x1d);
                      if ((uVar7 ^ ((uint)in[0x1e] << 0x10 | (uint)in[0x1d] << 0x18 |
                                    (uint)in[0x1f] << 8 | (uint)in[0x20])) != 0xffffffff) {
                        state->error = 0x39;
                        uVar8 = 0x39;
                      }
                    }
                  }
                  else {
                    state->error = 0x22;
                    uVar8 = 0x22;
                  }
                }
                else {
                  state->error = 0x21;
                  uVar8 = 0x21;
                }
              }
              else {
                state->error = 0x20;
                uVar8 = 0x20;
              }
            }
          }
        }
      }
      else {
        state->error = 0x5e;
        uVar8 = 0x5e;
      }
    }
    else {
      state->error = 0x1c;
      uVar8 = 0x1c;
    }
  }
  return uVar8;
}

Assistant:

unsigned lodepng_inspect(unsigned* w, unsigned* h, LodePNGState* state,
                         const unsigned char* in, size_t insize) {
  unsigned width, height;
  LodePNGInfo* info = &state->info_png;
  if(insize == 0 || in == 0) {
    CERROR_RETURN_ERROR(state->error, 48); /*error: the given data is empty*/
  }
  if(insize < 33) {
    CERROR_RETURN_ERROR(state->error, 27); /*error: the data length is smaller than the length of a PNG header*/
  }

  /*when decoding a new PNG image, make sure all parameters created after previous decoding are reset*/
  /* TODO: remove this. One should use a new LodePNGState for new sessions */
  lodepng_info_cleanup(info);
  lodepng_info_init(info);

  if(in[0] != 137 || in[1] != 80 || in[2] != 78 || in[3] != 71
     || in[4] != 13 || in[5] != 10 || in[6] != 26 || in[7] != 10) {
    CERROR_RETURN_ERROR(state->error, 28); /*error: the first 8 bytes are not the correct PNG signature*/
  }
  if(lodepng_chunk_length(in + 8) != 13) {
    CERROR_RETURN_ERROR(state->error, 94); /*error: header size must be 13 bytes*/
  }
  if(!lodepng_chunk_type_equals(in + 8, "IHDR")) {
    CERROR_RETURN_ERROR(state->error, 29); /*error: it doesn't start with a IHDR chunk!*/
  }

  /*read the values given in the header*/
  width = lodepng_read32bitInt(&in[16]);
  height = lodepng_read32bitInt(&in[20]);
  /*TODO: remove the undocumented feature that allows to give null pointers to width or height*/
  if(w) *w = width;
  if(h) *h = height;
  info->color.bitdepth = in[24];
  info->color.colortype = (LodePNGColorType)in[25];
  info->compression_method = in[26];
  info->filter_method = in[27];
  info->interlace_method = in[28];

  /*errors returned only after the parsing so other values are still output*/

  /*error: invalid image size*/
  if(width == 0 || height == 0) CERROR_RETURN_ERROR(state->error, 93);
  /*error: invalid colortype or bitdepth combination*/
  state->error = checkColorValidity(info->color.colortype, info->color.bitdepth);
  if(state->error) return state->error;
  /*error: only compression method 0 is allowed in the specification*/
  if(info->compression_method != 0) CERROR_RETURN_ERROR(state->error, 32);
  /*error: only filter method 0 is allowed in the specification*/
  if(info->filter_method != 0) CERROR_RETURN_ERROR(state->error, 33);
  /*error: only interlace methods 0 and 1 exist in the specification*/
  if(info->interlace_method > 1) CERROR_RETURN_ERROR(state->error, 34);

  if(!state->decoder.ignore_crc) {
    unsigned CRC = lodepng_read32bitInt(&in[29]);
    unsigned checksum = lodepng_crc32(&in[12], 17);
    if(CRC != checksum) {
      CERROR_RETURN_ERROR(state->error, 57); /*invalid CRC*/
    }
  }

  return state->error;
}